

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processLinkingCommand(CommonCore *this,ActionMessage *cmd)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  bool bVar1;
  action_t aVar2;
  BasicHandleInfo *pBVar3;
  size_t sVar4;
  HandleManager *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ActionMessage *in_RSI;
  long in_RDI;
  ActionMessage *in_stack_000000a8;
  BasicHandleInfo *ept_1;
  BasicHandleInfo *filt;
  BasicHandleInfo *target;
  ActionMessage *in_stack_00000108;
  CommonCore *in_stack_00000110;
  BasicHandleInfo *ept;
  BasicHandleInfo *input;
  BasicHandleInfo *pub;
  HandleManager *in_stack_000001f0;
  undefined1 in_stack_000001f8 [16];
  string_view in_stack_00000208;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  ActionMessage *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe88;
  InterfaceType type;
  HandleManager *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  GlobalFederateId local_124;
  __sv_type local_120;
  string_view local_110;
  GlobalHandle local_100;
  __sv_type local_f8;
  BasicHandleInfo *local_e8;
  GlobalHandle local_e0;
  __sv_type local_d8;
  string_view local_c8;
  pair<helics::route_id,_helics::ActionMessage> *local_b8;
  GlobalHandle local_b0;
  __sv_type local_a8;
  BasicHandleInfo *local_98;
  GlobalHandle local_90;
  ActionMessage *local_88;
  undefined1 in_stack_ffffffffffffff88 [16];
  
  type = (InterfaceType)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  aVar2 = ActionMessage::action(in_RSI);
  switch(aVar2) {
  case cmd_data_link:
    ActionMessage::name((ActionMessage *)0x485fa8);
    name_02._M_str = in_stack_fffffffffffffea0;
    name_02._M_len = in_stack_fffffffffffffe98;
    pBVar3 = HandleManager::getInterfaceHandle(in_stack_fffffffffffffe90,name_02,type);
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name_03._M_str = in_stack_fffffffffffffea0;
      name_03._M_len = in_stack_fffffffffffffe98;
      pBVar3 = HandleManager::getInterfaceHandle(in_stack_fffffffffffffe90,name_03,type);
      if (pBVar3 == (BasicHandleInfo *)0x0) {
        routeMessage(in_stack_00000110,in_stack_00000108);
      }
      else {
        ActionMessage::setAction(in_RSI,cmd_add_named_publication);
        ActionMessage::setSource(in_RSI,pBVar3->handle);
        ActionMessage::clearStringData((ActionMessage *)0x48615e);
        checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name._M_str._0_4_ = in_stack_fffffffffffffe70;
      name._M_len = in_stack_fffffffffffffe68;
      name._M_str._4_4_ = in_stack_fffffffffffffe74;
      ActionMessage::name((ActionMessage *)0x48603c,name);
      ActionMessage::setAction(in_RSI,cmd_add_named_input);
      ActionMessage::setSource(in_RSI,pBVar3->handle);
      ActionMessage::clearStringData((ActionMessage *)0x486083);
      checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
    }
    break;
  default:
    break;
  case cmd_filter_link:
    this_00 = (HandleManager *)(in_RDI + 0x758);
    local_c8 = ActionMessage::name((ActionMessage *)0x4863ae);
    name_06._M_str = in_stack_fffffffffffffea0;
    name_06._M_len = in_stack_fffffffffffffe98;
    local_b8 = (pair<helics::route_id,_helics::ActionMessage> *)
               HandleManager::getInterfaceHandle(this_00,name_06,type);
    if (local_b8 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name_07._M_str = in_stack_fffffffffffffea0;
      name_07._M_len = in_stack_fffffffffffffe98;
      local_e8 = HandleManager::getInterfaceHandle(this_00,name_07,type);
      if (local_e8 == (BasicHandleInfo *)0x0) {
        routeMessage(in_stack_00000110,in_stack_00000108);
      }
      else {
        ActionMessage::setAction(in_RSI,cmd_add_named_filter);
        local_100 = local_e8->handle;
        ActionMessage::setSource(in_RSI,local_100);
        checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name_01._M_str._0_4_ = in_stack_fffffffffffffe70;
      name_01._M_len = in_stack_fffffffffffffe68;
      name_01._M_str._4_4_ = in_stack_fffffffffffffe74;
      ActionMessage::name((ActionMessage *)0x486442,name_01);
      ActionMessage::setAction(in_RSI,cmd_add_named_endpoint);
      local_e0.fed_id.gid = (local_b8->first).rid;
      local_e0.handle.hid = *(BaseType *)&local_b8->field_0x4;
      ActionMessage::setSource(in_RSI,local_e0);
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>(local_b8,clone_flag);
      if (bVar1) {
        setActionFlag<helics::ActionMessage,helics::FilterFlags>(in_RSI,clone_flag);
      }
      checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
    }
    break;
  case cmd_endpoint_link:
    ActionMessage::name((ActionMessage *)0x486194);
    name_04._M_str = in_stack_fffffffffffffea0;
    name_04._M_len = in_stack_fffffffffffffe98;
    pBVar3 = HandleManager::getInterfaceHandle(in_stack_fffffffffffffe90,name_04,type);
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      sVar4 = in_RDI + 0x758;
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name_05._M_str = in_stack_fffffffffffffea0;
      name_05._M_len = sVar4;
      local_98 = HandleManager::getInterfaceHandle(in_stack_fffffffffffffe90,name_05,type);
      if (local_98 == (BasicHandleInfo *)0x0) {
        routeMessage(in_stack_00000110,in_stack_00000108);
      }
      else {
        ActionMessage::setAction(in_RSI,cmd_add_named_endpoint);
        local_b0 = local_98->handle;
        ActionMessage::setSource(in_RSI,local_b0);
        in_RSI->counter = 0x65;
        ActionMessage::clearStringData((ActionMessage *)0x486378);
        checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      name_00._M_str._0_4_ = in_stack_fffffffffffffe70;
      name_00._M_len = in_stack_fffffffffffffe68;
      name_00._M_str._4_4_ = in_stack_fffffffffffffe74;
      ActionMessage::name((ActionMessage *)0x486228,name_00);
      ActionMessage::setAction(in_RSI,cmd_add_named_endpoint);
      in_RSI->counter = 0x65;
      local_90 = pBVar3->handle;
      ActionMessage::setSource(in_RSI,local_90);
      setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(in_RSI,destination_target);
      ActionMessage::clearStringData((ActionMessage *)0x48628f);
      checkForNamedInterface((CommonCore *)ept_1,in_stack_000000a8);
    }
    break;
  case cmd_add_alias:
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x758);
    local_110 = SmallBuffer::to_string((SmallBuffer *)0x4865ae);
    ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffe78,(int)((ulong)this_01 >> 0x20));
    local_120 = std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
    HandleManager::addAlias(in_stack_000001f0,in_stack_00000208,(string_view)in_stack_000001f8);
    GlobalFederateId::GlobalFederateId(&local_124,(GlobalBrokerId)0x0);
    routeMessage(in_stack_ffffffffffffff88._0_8_,local_88,
                 (GlobalFederateId)in_stack_ffffffffffffff88._12_4_);
  }
  return;
}

Assistant:

void CommonCore::processLinkingCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DATA_LINK: {
            auto* pub = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_INPUT);
                cmd.setSource(pub->handle);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* input = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                             InterfaceType::INPUT);
                if (input == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    cmd.setSource(input->handle);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ENDPOINT_LINK: {
            auto* ept = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                cmd.setSource(ept->handle);
                setActionFlag(cmd, destination_target);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* target = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                              InterfaceType::ENDPOINT);
                if (target == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    cmd.setSource(target->handle);
                    cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_FILTER_LINK: {
            auto* filt = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.setSource(filt->handle);
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(cmd, clone_flag);
                }
                checkForNamedInterface(cmd);
            } else {
                auto* ept = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                           InterfaceType::ENDPOINT);
                if (ept == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    cmd.setSource(ept->handle);
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ADD_ALIAS: {
            loopHandles.addAlias(cmd.payload.to_string(), cmd.getString(targetStringLoc));
            routeMessage(std::move(cmd), parent_broker_id);
        } break;
        default:
            break;
    }
}